

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value
chaiscript::Boxed_Number::boolean_go<unsigned_long>(Opers t_oper,unsigned_long *t,unsigned_long *u)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar3;
  
  switch(in_ESI) {
  case 1:
    BVar3 = const_var(false);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case 2:
    BVar3 = const_var(false);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case 3:
    BVar3 = const_var(false);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case 4:
    BVar3 = const_var(false);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case 5:
    BVar3 = const_var(false);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case 6:
    BVar3 = const_var(false);
    _Var2._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  default:
    uVar1 = __cxa_allocate_exception(0x28);
    chaiscript::detail::exception::bad_any_cast::bad_any_cast((bad_any_cast *)in_RDI);
    __cxa_throw(uVar1,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value boolean_go(Operators::Opers t_oper, const T &t, const T &u)
      {
        switch (t_oper)
        {
          case Operators::equals:
            return const_var(t == u);
          case Operators::less_than:
            return const_var(t < u);
          case Operators::greater_than:
            return const_var(t > u);
          case Operators::less_than_equal:
            return const_var(t <= u);
          case Operators::greater_than_equal:
            return const_var(t >= u);
          case Operators::not_equal:
            return const_var(t != u);
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }
      }